

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O2

void anon_unknown.dwarf_2a8396::fillPixels(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  ushort *puVar1;
  Rgba *pRVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int x;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long local_70;
  
  uVar7 = (ulong)(uint)w;
  if (w < 1) {
    uVar7 = 0;
  }
  local_70 = 0;
  uVar4 = (ulong)(uint)h;
  if (h < 1) {
    uVar4 = 0;
  }
  for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    dVar9 = (double)(int)uVar3;
    lVar5 = 4;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      lVar6 = pixels->_sizeY * local_70;
      pRVar2 = pixels->_data;
      dVar10 = (double)(int)uVar8 * 0.1;
      dVar11 = sin(dVar10 + dVar9 * 0.1);
      Imath_3_2::half::operator=
                ((half *)((long)pRVar2 + lVar5 + lVar6 + -4),(float)(dVar11 * 0.5 + 0.5));
      dVar11 = sin(dVar10 + dVar9 * 0.2);
      puVar1 = (ushort *)((long)&(pRVar2->r)._h + lVar5 + lVar6);
      Imath_3_2::half::operator=((half *)(puVar1 + -1),(float)(dVar11 * 0.5 + 0.5));
      dVar10 = sin(dVar10 + dVar9 * 0.3);
      Imath_3_2::half::operator=
                ((half *)((long)&(pRVar2->r)._h + lVar5 + lVar6),(float)(dVar10 * 0.5 + 0.5));
      Imath_3_2::half::operator=
                ((half *)((long)&(pRVar2->g)._h + lVar5 + lVar6),
                 (*(float *)(_imath_half_to_float_table + (ulong)puVar1[-2] * 4) +
                  *(float *)(_imath_half_to_float_table + (ulong)*puVar1 * 4) +
                 *(float *)(_imath_half_to_float_table + (ulong)((half *)(puVar1 + -1))->_h * 4)) /
                 3.0);
      lVar5 = lVar5 + 8;
    }
    local_70 = local_70 + 8;
  }
  return;
}

Assistant:

void
fillPixels (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = 0.5 + 0.5 * sin (0.1 * x + 0.1 * y);
            p.g = 0.5 + 0.5 * sin (0.1 * x + 0.2 * y);
            p.b = 0.5 + 0.5 * sin (0.1 * x + 0.3 * y);
            p.a = (p.r + p.b + p.g) / 3.0;
        }
    }
}